

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O0

bool __thiscall InterCode::doArith(InterCode *this)

{
  bool bVar1;
  bool bVar2;
  int *in_RDI;
  bool isA2;
  bool isA1;
  int a2;
  int a1;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int iVar3;
  
  if ((0 < *in_RDI) && (*in_RDI < 5)) {
    bVar1 = Operand::getInt((Operand *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                            ,(int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    bVar2 = Operand::getInt((Operand *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                            ,(int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if ((in_RDI[0x1a] == 0) && (*in_RDI == 2)) {
      *in_RDI = 5;
      return true;
    }
    if ((bVar1) && (bVar2)) {
      iVar3 = *in_RDI;
      Operand::clear((Operand *)0x110dcb);
      Operand::Operand((Operand *)CONCAT44(iVar3,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff9c);
      Operand::operator=((Operand *)CONCAT44(iVar3,in_stack_ffffffffffffffa0),
                         (Operand *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      Operand::~Operand((Operand *)0x110df6);
      *in_RDI = 5;
      return true;
    }
    if ((bVar1) || (bVar2)) {
      if (bVar1) {
        if ((*in_RDI == 3) || (*in_RDI == 4)) {
          *in_RDI = 5;
          Operand::clear((Operand *)0x110e53);
          Operand::operator=((Operand *)
                             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                             (Operand *)
                             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        }
        else if (*in_RDI == 1) {
          *in_RDI = 5;
          Operand::operator=((Operand *)
                             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                             (Operand *)
                             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
          Operand::clear((Operand *)0x110e9d);
        }
      }
      else if (bVar2) {
        if (*in_RDI == 3) {
          *in_RDI = 5;
          Operand::clear((Operand *)0x110ecd);
          Operand::operator=((Operand *)
                             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                             (Operand *)
                             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        }
        else if ((*in_RDI == 1) || (*in_RDI == 2)) {
          *in_RDI = 5;
          Operand::clear((Operand *)0x110f0c);
        }
      }
    }
  }
  return false;
}

Assistant:

bool InterCode::doArith() {
    if (kind >= IC_ADD && kind <= IC_DIV) {
        int a1 = 0, a2 = 0;
        bool isA1 = arg1.getInt(a1), isA2 = arg2.getInt(a2);
        if (arg2.kind == IR_NONE && kind == IC_SUB) {
            a1 = -a1;
            kind = IC_ASSIGN;
            return true;
        }
        else if (isA1 && isA2) {
            switch (kind) {
                case IC_ADD: a1 += a2; break;
                case IC_SUB: a1 -= a2; break;
                case IC_MUL: a1 *= a2; break;
                default:     a1 /= a2;
            }
            arg2.clear();
            arg1 = Operand(a1);
            kind = IC_ASSIGN;
            return true;
        }
        else if (isA1 || isA2) {
            if (isA1 && a1 == 0) {
                if (kind == IC_MUL || kind == IC_DIV) {
                    kind = IC_ASSIGN;
                    arg2.clear();
                    arg1 = OP_ZERO;
                }
                else if (kind == IC_ADD) {
                    kind = IC_ASSIGN;
                    arg1 = arg2;
                    arg2.clear();
                }
            }
            else if (isA2 && a2 == 0) {
                if (kind == IC_MUL) {
                    kind = IC_ASSIGN;
                    arg2.clear();
                    arg1 = OP_ZERO;
                }
                else if (kind == IC_ADD || kind == IC_SUB) {
                    kind = IC_ASSIGN;
                    arg2.clear();
                }
            }
        }
    }
    return false;
}